

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void block_move(c2m_ctx_t c2m_ctx,op_t var,op_t val,mir_size_t size)

{
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar1;
  int64_t iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  MIR_disp_t MVar5;
  op_t index;
  op_t index_00;
  int iVar6;
  MIR_insn_t_conflict pMVar7;
  MIR_insn_t_conflict pMVar8;
  undefined8 in_stack_fffffffffffffe48;
  undefined8 in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  op_t local_d8 [2];
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  ctx = c2m_ctx->ctx;
  pgVar1 = c2m_ctx->gen_ctx;
  iVar6 = MIR_op_eq_p(ctx,var.mir_op,val.mir_op);
  if ((size != 0) && (iVar6 == 0)) {
    if (size < 6) {
      pMVar7 = MIR_new_label(ctx);
      get_new_temp(local_d8,c2m_ctx,MIR_T_I64);
      MIR_new_int_op(ctx,size);
      local_d8[0].mir_op.data._0_4_ = local_d8[0].mir_op.u.reg;
      local_d8[0].mir_op._8_2_ = (undefined2)local_d8[0].mir_op.u.mem.nonalias;
      local_d8[0].mir_op._10_2_ = (undefined2)((uint)local_d8[0].mir_op.u._8_4_ >> 0x10);
      local_d8[0].mir_op._12_2_ = (undefined2)local_d8[0].mir_op.u.mem.nloc;
      local_d8[0].mir_op._14_2_ = (undefined2)((uint)local_d8[0].mir_op.u._12_4_ >> 0x10);
      local_d8[0].mir_op.u.mem.nonalias = (undefined4)local_d8[0].mir_op.u.mem.disp;
      local_d8[0].mir_op.u.mem.nloc = (undefined4)((ulong)local_d8[0].mir_op.u._24_8_ >> 0x20);
      pMVar8 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar8);
      index._8_8_ = uStack_50;
      index.decl = (decl_t)uStack_58;
      index.mir_op.data = (void *)uStack_48;
      index.mir_op._8_8_ = uStack_40;
      index.mir_op.u.i = in_stack_fffffffffffffe48;
      index.mir_op.u.str.s = (char *)in_stack_fffffffffffffe50;
      index.mir_op.u._16_8_ = in_stack_fffffffffffffe58;
      index.mir_op.u.mem.disp = in_stack_fffffffffffffe60;
      modify_for_block_move(local_d8,c2m_ctx,val,index);
      val.mir_op._8_1_ = SUB21(local_d8[0].mir_op._8_2_,0);
      index_00._8_8_ = uStack_50;
      index_00.decl = (decl_t)uStack_58;
      index_00.mir_op.data = (void *)uStack_48;
      index_00.mir_op._8_8_ = uStack_40;
      index_00.mir_op.u.i = in_stack_fffffffffffffe48;
      index_00.mir_op.u.str.s = (char *)in_stack_fffffffffffffe50;
      index_00.mir_op.u._16_8_ = in_stack_fffffffffffffe58;
      index_00.mir_op.u.mem.disp = in_stack_fffffffffffffe60;
      modify_for_block_move(local_d8,c2m_ctx,var,index_00);
      var.mir_op._8_1_ = SUB21(local_d8[0].mir_op._8_2_,0);
      emit_label_insn_opt(c2m_ctx,pMVar7);
      local_d8[0].decl = (decl_t)(pgVar1->one_op).mir_op.data;
      local_d8[0]._8_8_ = *(undefined8 *)&(pgVar1->one_op).mir_op.field_0x8;
      iVar2 = (pgVar1->one_op).mir_op.u.i;
      uVar3 = *(undefined8 *)((long)&(pgVar1->one_op).mir_op.u + 8);
      uVar4 = *(undefined8 *)((long)&(pgVar1->one_op).mir_op.u + 0x10);
      MVar5 = (pgVar1->one_op).mir_op.u.mem.disp;
      local_d8[0].mir_op.u.reg = (undefined4)uVar4;
      local_d8[0].mir_op.u.mem.alias = (undefined4)((ulong)uVar4 >> 0x20);
      local_d8[0].mir_op.u.mem.nonalias = (undefined4)MVar5;
      local_d8[0].mir_op.u.mem.nloc = (undefined4)((ulong)MVar5 >> 0x20);
      local_d8[0].mir_op.data._0_4_ = (MIR_reg_t)iVar2;
      local_d8[0].mir_op.data._4_4_ = (undefined4)((ulong)iVar2 >> 0x20);
      local_d8[0].mir_op._8_2_ = (undefined2)uVar3;
      local_d8[0].mir_op._10_2_ = (undefined2)((ulong)uVar3 >> 0x10);
      local_d8[0].mir_op._12_2_ = (undefined2)((ulong)uVar3 >> 0x20);
      local_d8[0].mir_op._14_2_ = (undefined2)((ulong)uVar3 >> 0x30);
      pMVar8 = MIR_new_insn(c2m_ctx->ctx,MIR_SUB);
      emit_insn_opt(c2m_ctx,pMVar8);
      if ((var.mir_op._8_1_ != '\n') || (val.mir_op._8_1_ != '\n')) {
        __assert_fail("var.mir_op.mode == MIR_OP_MEM && val.mir_op.mode == MIR_OP_MEM",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2b31,"void block_move(c2m_ctx_t, op_t, op_t, mir_size_t)");
      }
      pMVar8 = MIR_new_insn(c2m_ctx->ctx,MIR_MOV);
      emit_insn_opt(c2m_ctx,pMVar8);
      MIR_new_label_op(ctx,pMVar7);
      local_d8[0].decl = (decl_t)(pgVar1->zero_op).mir_op.data;
      local_d8[0]._8_8_ = *(undefined8 *)&(pgVar1->zero_op).mir_op.field_0x8;
      iVar2 = (pgVar1->zero_op).mir_op.u.i;
      uVar3 = *(undefined8 *)((long)&(pgVar1->zero_op).mir_op.u + 8);
      uVar4 = *(undefined8 *)((long)&(pgVar1->zero_op).mir_op.u + 0x10);
      MVar5 = (pgVar1->zero_op).mir_op.u.mem.disp;
      local_d8[0].mir_op.u.reg = (undefined4)uVar4;
      local_d8[0].mir_op.u.mem.alias = (undefined4)((ulong)uVar4 >> 0x20);
      local_d8[0].mir_op.u.mem.nonalias = (undefined4)MVar5;
      local_d8[0].mir_op.u.mem.nloc = (undefined4)((ulong)MVar5 >> 0x20);
      local_d8[0].mir_op.data._0_4_ = (MIR_reg_t)iVar2;
      local_d8[0].mir_op.data._4_4_ = (undefined4)((ulong)iVar2 >> 0x20);
      local_d8[0].mir_op._8_2_ = (undefined2)uVar3;
      local_d8[0].mir_op._10_2_ = (undefined2)((ulong)uVar3 >> 0x10);
      local_d8[0].mir_op._12_2_ = (undefined2)((ulong)uVar3 >> 0x20);
      local_d8[0].mir_op._14_2_ = (undefined2)((ulong)uVar3 >> 0x30);
      pMVar7 = MIR_new_insn(c2m_ctx->ctx,MIR_BGT);
      emit_insn_opt(c2m_ctx,pMVar7);
    }
    else {
      mem_to_address(local_d8,c2m_ctx,var,1);
      if (local_d8[0].mir_op._8_1_ != '\x01') {
        __assert_fail("var.mir_op.mode == MIR_OP_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x2b27,"void block_move(c2m_ctx_t, op_t, op_t, mir_size_t)");
      }
      gen_memcpy(c2m_ctx,0,local_d8[0].mir_op.u.reg,val,size);
    }
  }
  return;
}

Assistant:

static void block_move (c2m_ctx_t c2m_ctx, op_t var, op_t val, mir_size_t size) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_label_t repeat_label;
  op_t index;

  if (MIR_op_eq_p (ctx, var.mir_op, val.mir_op) || size == 0) return;
  if (size > 5) {
    var = mem_to_address (c2m_ctx, var, TRUE);
    assert (var.mir_op.mode == MIR_OP_REG);
    gen_memcpy (c2m_ctx, 0, var.mir_op.u.reg, val, size);
  } else {
    repeat_label = MIR_new_label (ctx);
    index = get_new_temp (c2m_ctx, MIR_T_I64);
    emit2 (c2m_ctx, MIR_MOV, index.mir_op, MIR_new_int_op (ctx, size));
    val = modify_for_block_move (c2m_ctx, val, index);
    var = modify_for_block_move (c2m_ctx, var, index);
    emit_label_insn_opt (c2m_ctx, repeat_label);
    emit3 (c2m_ctx, MIR_SUB, index.mir_op, index.mir_op, one_op.mir_op);
    assert (var.mir_op.mode == MIR_OP_MEM && val.mir_op.mode == MIR_OP_MEM);
    val.mir_op.u.mem.type = var.mir_op.u.mem.type = MIR_T_I8;
    emit2 (c2m_ctx, MIR_MOV, var.mir_op, val.mir_op);
    emit3 (c2m_ctx, MIR_BGT, MIR_new_label_op (ctx, repeat_label), index.mir_op, zero_op.mir_op);
  }
}